

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O1

void __thiscall
Patch::Node::write_dot_graph
          (Node *this,stringstream *result,Point left_ancestor_old_end,Point left_ancestor_new_end)

{
  Node *pNVar1;
  Point left_ancestor_old_end_00;
  Point left_ancestor_new_end_00;
  ostream *poVar2;
  ostream *stream;
  Point node_old_start;
  Point node_new_start;
  Point local_50;
  Point local_48;
  Point local_40;
  Point local_38;
  
  local_48 = left_ancestor_new_end;
  local_40 = left_ancestor_old_end;
  local_50 = Point::traverse(&local_40,&this->old_distance_from_left_ancestor);
  local_38 = Point::traverse(&local_48,&this->new_distance_from_left_ancestor);
  left_ancestor_old_end_00 = Point::traverse(&local_50,&this->old_extent);
  left_ancestor_new_end_00 = Point::traverse(&local_38,&this->new_extent);
  stream = (ostream *)(result + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"node_",5);
  poVar2 = std::ostream::_M_insert<void_const*>(stream);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," [",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"label=\"",7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"new range: ",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," - ",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"old range: ",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," - ",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"new text: ",10);
  if ((this->new_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
      super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
      super__Head_base<0UL,_Text_*,_false>._M_head_impl == (Text *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"null",4);
    poVar2 = stream;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\\\"",2);
    poVar2 = operator<<(stream,(this->new_text)._M_t.
                               super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
                               super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
                               super__Head_base<0UL,_Text_*,_false>._M_head_impl);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\\\"",2);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"old text: ",10);
  if ((this->old_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
      super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
      super__Head_base<0UL,_Text_*,_false>._M_head_impl == (Text *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"null",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + (char)stream);
    std::ostream::put((char)stream);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(stream,"old text size:",0xe);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)stream);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\\\"",2);
    poVar2 = operator<<(stream,(this->old_text)._M_t.
                               super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
                               super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
                               super__Head_base<0UL,_Text_*,_false>._M_head_impl);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\\\"",2);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"old_subtree_text_size: ",0x17);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)stream);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"new_subtree_text_size: ",0x17);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)stream);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\"",1);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"tooltip=\"",9);
  poVar2 = std::ostream::_M_insert<void_const*>(stream);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"]",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"node_",5);
  poVar2 = std::ostream::_M_insert<void_const*>(stream);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," -> ",4);
  pNVar1 = this->left;
  std::__ostream_insert<char,std::char_traits<char>>(stream,"node_",5);
  if (pNVar1 == (Node *)0x0) {
    poVar2 = std::ostream::_M_insert<void_const*>(stream);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"_left_null",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(stream,"node_",5);
    poVar2 = std::ostream::_M_insert<void_const*>(stream);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"_left_null [label=\"\" shape=point]",0x21);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  else {
    poVar2 = std::ostream::_M_insert<void_const*>(stream);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    write_dot_graph(this->left,result,local_40,local_48);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"node_",5);
  poVar2 = std::ostream::_M_insert<void_const*>(stream);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," -> ",4);
  pNVar1 = this->right;
  std::__ostream_insert<char,std::char_traits<char>>(stream,"node_",5);
  if (pNVar1 == (Node *)0x0) {
    poVar2 = std::ostream::_M_insert<void_const*>(stream);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"_right_null",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(stream,"node_",5);
    poVar2 = std::ostream::_M_insert<void_const*>(stream);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"_right_null [label=\"\" shape=point]",0x22);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  else {
    poVar2 = std::ostream::_M_insert<void_const*>(stream);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    write_dot_graph(this->right,result,left_ancestor_old_end_00,left_ancestor_new_end_00);
  }
  return;
}

Assistant:

void write_dot_graph(std::stringstream &result, Point left_ancestor_old_end, Point left_ancestor_new_end) {
    Point node_old_start = left_ancestor_old_end.traverse(old_distance_from_left_ancestor);
    Point node_new_start = left_ancestor_new_end.traverse(new_distance_from_left_ancestor);
    Point node_old_end = node_old_start.traverse(old_extent);
    Point node_new_end = node_new_start.traverse(new_extent);

    result << "node_" << this << " ["
      << "label=\""
      << "new range: " << node_new_start << " - " << node_new_end << ", " << endl
      << "old range: " << node_old_start << " - " << node_old_end << ", " << endl
      << "new text: ";

    if (new_text) {
      result << "\\\"" << *new_text << "\\\"" << endl;
    } else {
      result << "null" << endl;
    }

    result << "old text: ";
    if (old_text) {
      result << "\\\"" << *old_text <<  "\\\""  << endl;
    } else {
      result << "null" << endl;
      result << "old text size:" << old_text_size_ << endl;
    }

    result << "old_subtree_text_size: " << old_subtree_text_size << endl;
    result << "new_subtree_text_size: " << new_subtree_text_size << endl;

    result << "\""
      << "tooltip=\"" << this
      << "\"]" << endl;

    result << "node_" << this << " -> ";
    if (left) {
      result << "node_" << left << endl;
      left->write_dot_graph(result, left_ancestor_old_end, left_ancestor_new_end);
    } else {
      result << "node_" << this << "_left_null" << endl;
      result << "node_" << this << "_left_null [label=\"\" shape=point]" << endl;
    }

    result << "node_" << this << " -> ";
    if (right) {
      result << "node_" << right << endl;
      right->write_dot_graph(result, node_old_end, node_new_end);
    } else {
      result << "node_" << this << "_right_null" << endl;
      result << "node_" << this << "_right_null [label=\"\" shape=point]" << endl;
    }
  }